

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O3

Vec_Ptr_t * Io_ReadBlifGetTokens(Io_ReadBlif_t *p)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  size_t sVar5;
  char *pcVar6;
  void **ppvVar7;
  void *pvVar8;
  long lVar9;
  int *piVar10;
  
  pVVar4 = p->vNewTokens;
  if (0 < pVVar4->nSize) {
    lVar9 = 0;
    do {
      if (pVVar4->pArray[lVar9] != (void *)0x0) {
        free(pVVar4->pArray[lVar9]);
        p->vNewTokens->pArray[lVar9] = (void *)0x0;
        pVVar4 = p->vNewTokens;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar4->nSize);
    pVVar4->nSize = 0;
  }
  pVVar4 = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
  if (pVVar4 == (Vec_Ptr_t *)0x0) {
    pVVar4 = (Vec_Ptr_t *)0x0;
  }
  else {
    pcVar6 = (char *)pVVar4->pArray[(long)pVVar4->nSize + -1];
    sVar5 = strlen(pcVar6);
    if (pcVar6[sVar5 - 1] == '\\') {
      pcVar6[sVar5 - 1] = '\0';
      iVar3 = pVVar4->nSize;
      if (*pcVar6 == '\0') {
        iVar3 = iVar3 + -1;
        pVVar4->nSize = iVar3;
      }
      if (0 < iVar3) {
        lVar9 = 0;
        do {
          pVVar2 = p->vNewTokens;
          pcVar6 = Extra_UtilStrsav((char *)pVVar4->pArray[lVar9]);
          uVar1 = pVVar2->nSize;
          if (uVar1 == pVVar2->nCap) {
            if ((int)uVar1 < 0x10) {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = ppvVar7;
              pVVar2->nCap = 0x10;
            }
            else {
              if (pVVar2->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar7 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
              }
              pVVar2->pArray = ppvVar7;
              pVVar2->nCap = uVar1 * 2;
            }
          }
          else {
            ppvVar7 = pVVar2->pArray;
          }
          iVar3 = pVVar2->nSize;
          pVVar2->nSize = iVar3 + 1;
          ppvVar7[iVar3] = pcVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar4->nSize);
      }
      pvVar8 = Extra_FileReaderGetTokens(p->pReader);
      iVar3 = *(int *)((long)pvVar8 + 4);
      while (iVar3 != 0) {
        piVar10 = (int *)((long)pvVar8 + 4);
        pcVar6 = *(char **)(*(long *)((long)pvVar8 + 8) + -8 + (long)iVar3 * 8);
        sVar5 = strlen(pcVar6);
        if (pcVar6[sVar5 - 1] != '\\') {
          if (0 < iVar3) {
            lVar9 = 0;
            do {
              pVVar4 = p->vNewTokens;
              pcVar6 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar8 + 8) + lVar9 * 8));
              uVar1 = pVVar4->nSize;
              if (uVar1 == pVVar4->nCap) {
                if ((int)uVar1 < 0x10) {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
                  }
                  pVVar4->pArray = ppvVar7;
                  pVVar4->nCap = 0x10;
                }
                else {
                  if (pVVar4->pArray == (void **)0x0) {
                    ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
                  }
                  pVVar4->pArray = ppvVar7;
                  pVVar4->nCap = uVar1 * 2;
                }
              }
              else {
                ppvVar7 = pVVar4->pArray;
              }
              iVar3 = pVVar4->nSize;
              pVVar4->nSize = iVar3 + 1;
              ppvVar7[iVar3] = pcVar6;
              lVar9 = lVar9 + 1;
            } while (lVar9 < *piVar10);
          }
          break;
        }
        pcVar6[sVar5 - 1] = '\0';
        iVar3 = *piVar10;
        if (*pcVar6 == '\0') {
          iVar3 = iVar3 + -1;
          *piVar10 = iVar3;
        }
        if (0 < iVar3) {
          lVar9 = 0;
          do {
            pVVar4 = p->vNewTokens;
            pcVar6 = Extra_UtilStrsav(*(char **)(*(long *)((long)pvVar8 + 8) + lVar9 * 8));
            uVar1 = pVVar4->nSize;
            if (uVar1 == pVVar4->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar4->pArray,0x80);
                }
                pVVar4->pArray = ppvVar7;
                pVVar4->nCap = 0x10;
              }
              else {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar4->pArray,(ulong)uVar1 << 4);
                }
                pVVar4->pArray = ppvVar7;
                pVVar4->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar7 = pVVar4->pArray;
            }
            iVar3 = pVVar4->nSize;
            pVVar4->nSize = iVar3 + 1;
            ppvVar7[iVar3] = pcVar6;
            lVar9 = lVar9 + 1;
          } while (lVar9 < *piVar10);
        }
        pvVar8 = Extra_FileReaderGetTokens(p->pReader);
        iVar3 = *(int *)((long)pvVar8 + 4);
      }
      pVVar4 = p->vNewTokens;
    }
  }
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Io_ReadBlifGetTokens( Io_ReadBlif_t * p )
{
    Vec_Ptr_t * vTokens;
    char * pLastToken;
    int i;

    // get rid of the old tokens
    if ( p->vNewTokens->nSize > 0 )
    {
        for ( i = 0; i < p->vNewTokens->nSize; i++ )
            ABC_FREE( p->vNewTokens->pArray[i] );
        p->vNewTokens->nSize = 0;
    }

    // get the new tokens
    vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
    if ( vTokens == NULL )
        return vTokens;

    // check if there is a transfer to another line
    pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
    if ( pLastToken[ strlen(pLastToken)-1 ] != '\\' )
        return vTokens;

    // remove the slash
    pLastToken[ strlen(pLastToken)-1 ] = 0;
    if ( pLastToken[0] == 0 )
        vTokens->nSize--;
    // load them into the new array
    for ( i = 0; i < vTokens->nSize; i++ )
        Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );

    // load as long as there is the line break
    while ( 1 )
    {
        // get the new tokens
        vTokens = (Vec_Ptr_t *)Extra_FileReaderGetTokens(p->pReader);
        if ( vTokens->nSize == 0 )
            return p->vNewTokens;
        // check if there is a transfer to another line
        pLastToken = (char *)vTokens->pArray[vTokens->nSize - 1];
        if ( pLastToken[ strlen(pLastToken)-1 ] == '\\' )
        {
            // remove the slash
            pLastToken[ strlen(pLastToken)-1 ] = 0;
            if ( pLastToken[0] == 0 )
                vTokens->nSize--;
            // load them into the new array
            for ( i = 0; i < vTokens->nSize; i++ )
                Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
            continue;
        }
        // otherwise, load them and break
        for ( i = 0; i < vTokens->nSize; i++ )
            Vec_PtrPush( p->vNewTokens, Extra_UtilStrsav((char *)vTokens->pArray[i]) );
        break;
    }
    return p->vNewTokens;
}